

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

reg_object fitOCSB(double *x,int N,int f,int lag,int mlags)

{
  int iVar1;
  int iVar2;
  double *oup;
  double *oup_00;
  double *__ptr;
  double *x_00;
  double *pdVar3;
  double *pdVar4;
  reg_object obj;
  double *__ptr_00;
  double *pdVar5;
  void *__ptr_01;
  void *__src;
  double *__ptr_02;
  double *inp_00;
  void *__ptr_03;
  void *__src_00;
  double *x_01;
  long lVar6;
  double dVar7;
  double local_108;
  double var [2];
  reg_object fitout;
  reg_object fit;
  double alpha;
  int mfrows;
  int Nz5y;
  int Nz4y;
  double *z5_y2;
  double *y2;
  double *XX;
  double *z5;
  double *z5_preds;
  double *z5_lag;
  double *z5_y;
  double *inp;
  double *z4;
  double *z4_preds;
  double *z4_lag;
  double *z4_y;
  double *varcovar;
  double *res;
  double *mf;
  double *ylag;
  double *y;
  double *y_fdiff;
  int local_38;
  int p;
  int ylcols;
  int ylrows;
  int Ny;
  int Nyf;
  int j;
  int i;
  int mlags_local;
  int lag_local;
  int f_local;
  int N_local;
  double *x_local;
  
  j = mlags;
  i = lag;
  mlags_local = f;
  lag_local = N;
  _f_local = x;
  oup = (double *)malloc((long)N << 3);
  oup_00 = (double *)malloc((long)lag_local << 3);
  memset(&local_108,0,0x10);
  ylrows = diffs(_f_local,lag_local,1,mlags_local,oup);
  ylcols = diff(oup,ylrows,1,oup_00);
  __ptr = genLags(oup_00,ylcols,i,&p,&local_38);
  if (-1 < j) {
    z5_y2 = oup_00 + j;
    ylcols = ylcols - j;
  }
  x_00 = (double *)malloc((long)p * 8 * (long)ylcols);
  iVar2 = p;
  for (Nyf = 0; Nyf < p; Nyf = Nyf + 1) {
    memcpy(x_00 + ylcols * Nyf,__ptr + local_38 * Nyf,(long)ylcols << 3);
  }
  iVar1 = p + 1;
  pdVar3 = (double *)malloc((long)iVar1 * 8 * (long)iVar1);
  pdVar4 = (double *)malloc((long)ylcols << 3);
  obj = reg_init(ylcols,iVar1);
  regress(obj,x_00,z5_y2,pdVar4,pdVar3,0.95);
  lVar6 = (long)i;
  iVar1 = ylrows - i;
  __ptr_00 = genLags(oup,ylrows,i,&p,&local_38);
  pdVar5 = (double *)malloc((long)local_38 << 3);
  __ptr_01 = malloc((long)iVar1 << 3);
  __src = malloc((long)iVar1 << 3);
  for (Nyf = 0; Nyf < iVar1; Nyf = Nyf + 1) {
    for (Ny = 0; Ny < p; Ny = Ny + 1) {
      pdVar5[Ny] = __ptr_00[Ny * local_38 + Nyf];
    }
    dVar7 = fitted(obj,pdVar5,pdVar3,&local_108);
    *(double *)((long)__ptr_01 + (long)Nyf * 8) = dVar7;
    *(double *)((long)__src + (long)Nyf * 8) =
         oup[lVar6 + Nyf] - *(double *)((long)__ptr_01 + (long)Nyf * 8);
  }
  free(pdVar5);
  pdVar5 = (double *)malloc((long)lag_local << 3);
  iVar1 = diff(_f_local,lag_local,1,pdVar5);
  __ptr_02 = genLags(pdVar5,iVar1,i,&p,&local_38);
  lVar6 = (long)i;
  iVar1 = iVar1 - i;
  inp_00 = (double *)malloc((long)local_38 << 3);
  __ptr_03 = malloc((long)iVar1 << 3);
  __src_00 = malloc((long)iVar1 << 3);
  for (Nyf = 0; Nyf < iVar1; Nyf = Nyf + 1) {
    for (Ny = 0; Ny < p; Ny = Ny + 1) {
      inp_00[Ny] = __ptr_02[Ny * local_38 + Nyf];
    }
    dVar7 = fitted(obj,inp_00,pdVar3,&local_108);
    *(double *)((long)__ptr_03 + (long)Nyf * 8) = dVar7;
    *(double *)((long)__src_00 + (long)Nyf * 8) =
         pdVar5[lVar6 + Nyf] - *(double *)((long)__ptr_03 + (long)Nyf * 8);
  }
  x_01 = (double *)malloc((long)(iVar2 + 2) * 8 * (long)ylcols);
  memcpy(x_01,x_00,(long)iVar2 * 8 * (long)ylcols);
  memcpy(x_01 + iVar2 * ylcols,__src,(long)ylcols << 3);
  memcpy(x_01 + (iVar2 + 1) * ylcols,__src_00,(long)ylcols << 3);
  free(pdVar3);
  free(pdVar4);
  iVar2 = iVar2 + 2;
  var[1] = (double)reg_init(ylcols,iVar2);
  setIntercept((reg_object)var[1],0);
  pdVar3 = (double *)malloc((long)iVar2 * 8 * (long)iVar2);
  pdVar4 = (double *)malloc((long)ylcols << 3);
  regress((reg_object)var[1],x_01,z5_y2,pdVar4,pdVar3,0.95);
  free(oup);
  free(pdVar3);
  free(__ptr);
  free(x_00);
  free(pdVar4);
  free_reg(obj);
  free(__ptr_00);
  free(inp_00);
  free(__ptr_01);
  free(oup_00);
  free(pdVar5);
  free(__ptr_02);
  free(__src);
  free(__src_00);
  free(__ptr_03);
  free(x_01);
  return (reg_object)var[1];
}

Assistant:

reg_object fitOCSB(double *x, int N, int f, int lag, int mlags) {
    int i,j,Nyf,Ny, ylrows, ylcols,p;
    double *y_fdiff, *y, *ylag, *mf, *res, *varcovar;
    double *z4_y,*z4_lag,*z4_preds,*z4,*inp,*z5_y,*z5_lag,*z5_preds,*z5,*XX;
    double *y2,*z5_y2;
    int Nz4y,Nz5y,mfrows;
    double alpha;
    reg_object fit;
    reg_object fitout;

    y_fdiff = (double*)malloc(sizeof(double)*N);
    y = (double*)malloc(sizeof(double)*N);
    double var[2] = {0,0};

    Nyf = diffs(x,N,1,f,y_fdiff);
    Ny = diff(y_fdiff,Nyf,1,y);

    //mdisplay(y_fdiff,1,Nyf);
    //mdisplay(y,1,Ny);

    ylag = genLags(y,Ny,lag,&ylrows,&ylcols);

    //mdisplay(ylag,ylrows,ylcols);

    if (mlags > -1) {
        y2 = &y[mlags];
        Ny -= mlags;
    }

    //mdisplay(y,1,Ny);

    mf = (double*) malloc(sizeof(double)*ylrows*Ny);
    mfrows = ylrows;

    for(i = 0; i < ylrows;++i) {
        memcpy(mf+Ny*i,ylag+ylcols*i,sizeof(double)*Ny);
    }

    //mdisplay(mf,ylrows,Ny);

    p = ylrows + 1;
    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);
    alpha = 0.95;
    fit = reg_init(Ny,p);

    regress(fit,mf,y2,res,varcovar,alpha);

    //summary(fit);
    //printf("loglik %g aic %g bic %g aicc %g \n",fit->loglik,fit->aic,fit->bic,fit->aicc);

    z4_y = &y_fdiff[lag];
    Nz4y = Nyf - lag;
    //mdisplay(z4_y,1,Nz4y);

    z4_lag = genLags(y_fdiff,Nyf,lag,&ylrows,&ylcols);

    //mdisplay(z4_lag,ylrows,ylcols);

    inp = (double*) malloc(sizeof(double)*ylcols);
    z4_preds = (double*) malloc(sizeof(double)*Nz4y);
    z4 = (double*) malloc(sizeof(double)*Nz4y);

    //printf("nz4y %d ylrows %d ylcols %d",Nz4y,ylrows,ylcols);

    for(i = 0; i < Nz4y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z4_lag[j*ylcols+i];
        }

        z4_preds[i] = fitted(fit,inp,varcovar,var);
        z4[i] = z4_y[i] - z4_preds[i];
    }

    free(inp);

    //mdisplay(z4_preds,1,Nz4y);

    z5_y = (double*)malloc(sizeof(double)*N);

    Nz5y = diff(x,N,1,z5_y);

    z5_lag = genLags(z5_y,Nz5y,lag,&ylrows,&ylcols);

    z5_y2 = &z5_y[lag];
    Nz5y -= lag;

    inp = (double*) malloc(sizeof(double)*ylcols);
    z5_preds = (double*) malloc(sizeof(double)*Nz5y);
    z5 = (double*) malloc(sizeof(double)*Nz5y);

    for(i = 0; i < Nz5y;++i) {
        for(j = 0; j < ylrows;++j) {
            inp[j] = z5_lag[j*ylcols+i];
        }

        z5_preds[i] = fitted(fit,inp,varcovar,var);
        z5[i] = z5_y2[i] - z5_preds[i];
    }

    //mdisplay(z5_preds,1,Nz5y);

    XX = (double*) malloc(sizeof(double)*(mfrows+2) * Ny);
    memcpy(XX,mf,sizeof(double)*mfrows*Ny);
    memcpy(XX+mfrows*Ny,z4,sizeof(double)*Ny);
    memcpy(XX+(mfrows+1)*Ny,z5,sizeof(double)*Ny);

    //mdisplay(XX,mfrows+2,Ny);
    //mdisplay(y,1,Ny);

    free(varcovar);
    free(res);

    p = mfrows+2;

    fitout = reg_init(Ny,p);
    setIntercept(fitout,0);

    varcovar = (double*)malloc(sizeof(double)*p*p);
    res = (double*)malloc(sizeof(double)*Ny);

    regress(fitout,XX,y2,res,varcovar,alpha);

	
    free(y_fdiff);
    free(varcovar);
    free(ylag);
    free(mf);
    free(res);
    free_reg(fit);
    free(z4_lag);
    free(inp);
    free(z4_preds);
    free(y);
    free(z5_y);
    free(z5_lag);
    free(z4);
    free(z5);
    free(z5_preds);
    free(XX);
 

    return fitout;
}